

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElement::~IfcTransportElement(IfcTransportElement *this)

{
  ~IfcTransportElement
            ((IfcTransportElement *)
             &this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70);
  return;
}

Assistant:

IfcTransportElement() : Object("IfcTransportElement") {}